

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void __thiscall
pstore::broker::command_processor::process_command
          (command_processor *this,fifo_path *fifo,message_type *msg)

{
  bool bVar1;
  gc_watch_thread *this_00;
  unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
  command;
  undefined1 local_50 [8];
  tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
  local_48;
  
  parse((command_processor *)local_50,(message_type *)this);
  if ((tuple<pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
      )local_50 != (_Head_base<0UL,_pstore::broker::broker_command_*,_false>)0x0) {
    (*this->_vptr_command_processor[9])(this,local_50);
    local_48.
    super__Tuple_impl<0UL,_const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
    .super__Head_base<0UL,_const_char_*,_false>._M_head_impl = *(char **)local_50;
    local_48.
    super__Tuple_impl<0UL,_const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
    .
    super__Tuple_impl<1UL,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
    .
    super__Head_base<1UL,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>,_false>
    ._M_head_impl.super__Function_base._M_manager = (_Manager_type)0x0;
    local_48.
    super__Tuple_impl<0UL,_const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
    .
    super__Tuple_impl<1UL,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
    .
    super__Head_base<1UL,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>,_false>
    ._M_head_impl._M_invoker = (_Invoker_type)0x0;
    local_48.
    super__Tuple_impl<0UL,_const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
    .
    super__Tuple_impl<1UL,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
    .
    super__Head_base<1UL,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>,_false>
    ._M_head_impl.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_48.
    super__Tuple_impl<0UL,_const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
    .
    super__Tuple_impl<1UL,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
    .
    super__Head_base<1UL,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>,_false>
    ._M_head_impl.super__Function_base._M_functor._8_8_ =
         (maybe<pstore::http::server_status,_void> *)0x0;
    this_00 = (gc_watch_thread *)
              std::
              __lower_bound<std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>const*,std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>const&,std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>const&)>>
                        ((tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
                          *)&commands_,
                         (tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
                          *)&getgc::gc,&local_48,
                         (_Iter_comp_val<bool_(*)(const_std::tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>_&,_const_std::tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>_&)>
                          )0x117aa8);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    if (this_00 != &getgc::gc) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,(char *)(this_00->mut_).super___mutex_base._M_mutex.__data.
                                               __list.__prev);
      if (bVar1) {
        std::
        function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
        ::operator()((function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
                      *)this_00,this,fifo,(broker_command *)local_50);
        goto LAB_001176a1;
      }
    }
    (*this->_vptr_command_processor[8])(this,local_50);
  }
LAB_001176a1:
  std::
  unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>::
  ~unique_ptr((unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
               *)local_50);
  return;
}

Assistant:

void command_processor::process_command (brokerface::fifo_path const & fifo,
                                                 brokerface::message_type const & msg) {
            auto const command = this->parse (msg);
            if (broker_command const * const c = command.get ()) {
                this->log (*c);
                auto const pos = std::lower_bound (std::begin (commands_), std::end (commands_),
                                                   command_entry (c->verb.c_str (), nullptr),
                                                   command_entry_compare);
                if (pos != std::end (commands_) && c->verb == std::get<gsl::czstring> (*pos)) {
                    std::get<handler> (*pos) (this, fifo, *c);
                } else {
                    this->unknown (*c);
                }
            }
        }